

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_structure.cpp
# Opt level: O0

void __thiscall itis::SplayTree::Clear(SplayTree *this,Node *x)

{
  Node *x_local;
  SplayTree *this_local;
  
  if (x != (Node *)0x0) {
    if ((x->left_child == (Node *)0x0) && (x->right_child == (Node *)0x0)) {
      if (x != (Node *)0x0) {
        operator_delete(x,0x20);
      }
    }
    else if ((x->left_child == (Node *)0x0) || (x->right_child != (Node *)0x0)) {
      if ((x->left_child == (Node *)0x0) && (x->right_child != (Node *)0x0)) {
        Clear(this,x->right_child);
        if (x != (Node *)0x0) {
          operator_delete(x,0x20);
        }
      }
      else {
        Clear(this,x->left_child);
      }
    }
    else {
      Clear(this,x->left_child);
      if (x != (Node *)0x0) {
        operator_delete(x,0x20);
      }
    }
  }
  return;
}

Assistant:

void SplayTree::Clear(Node *x) {
    if (x != nullptr) {
      if (x->left_child != nullptr || x->right_child != nullptr) {
        if (x->left_child != nullptr && x->right_child == nullptr) {
          Clear(x->left_child);
          delete x;
        } else if (x->left_child == nullptr && x->right_child != nullptr) {
          Clear(x->right_child);
          delete x;
        } else {
          Clear(x->left_child);
        }
      } else {
        delete x;
      }
    }
  }